

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void handle_conn_shutdown(EVmaster master,EVmaster_msg_ptr msg)

{
  uint uVar1;
  EVdfg p_Var2;
  FILE *pFVar3;
  int iVar4;
  __pid_t _Var5;
  int iVar6;
  EVdfg_stone_state *pp_Var7;
  pthread_t pVar8;
  EVdfg_stone_state p_Var9;
  EVdfg_configuration p_Var10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  EVdfg_stone_state p_Var15;
  int target_stone;
  timespec ts;
  char *contact_str;
  uint local_64;
  long local_60;
  timespec local_58;
  char *local_48;
  long local_40;
  char *local_38;
  
  iVar6 = (msg->u).flush_reconfig.reconfig;
  p_Var2 = master->dfg;
  pp_Var7 = p_Var2->deployed_state->stones;
  p_Var9 = *pp_Var7;
  if (p_Var9->stone_id != iVar6) {
    lVar11 = 1;
    do {
      p_Var9 = pp_Var7[lVar11];
      lVar11 = lVar11 + 1;
    } while (p_Var9->stone_id != iVar6);
  }
  p_Var9->condition = EVstone_Frozen;
  master->state = DFG_Reconfiguring;
  local_60 = CONCAT44(local_60._4_4_,iVar6);
  iVar4 = CMtrace_val[0xd];
  if (master->cm->CMTrace_file == (FILE *)0x0) {
    iVar4 = CMtrace_init(master->cm,EVdfgVerbose);
  }
  if (iVar4 != 0) {
    if (CMtrace_PID != 0) {
      pFVar3 = (FILE *)master->cm->CMTrace_file;
      _Var5 = getpid();
      pVar8 = pthread_self();
      iVar6 = (int)local_60;
      fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar8);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_58);
      fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
    }
    fprintf((FILE *)master->cm->CMTrace_file,
            "EVDFG conn_shutdown_handler -  master DFG state is now %s\n",str_state[master->state]);
  }
  fflush((FILE *)master->cm->CMTrace_file);
  if (master->node_fail_handler != (EVmasterFailHandlerFunc)0x0) {
    local_64 = 0xffffffff;
    local_38 = (char *)0x0;
    iVar4 = CMtrace_val[0xd];
    if (master->cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(master->cm,EVdfgVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar3 = (FILE *)master->cm->CMTrace_file;
        _Var5 = getpid();
        pVar8 = pthread_self();
        iVar6 = (int)local_60;
        fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_58);
        fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
      }
      fwrite("IN CONN_SHUTDOWN_HANDLER\n",0x19,1,(FILE *)master->cm->CMTrace_file);
    }
    fflush((FILE *)master->cm->CMTrace_file);
    if (0 < p_Var2->stone_count) {
      uVar14 = 0;
      do {
        p_Var10 = p_Var2->deployed_state;
        pp_Var7 = p_Var10->stones;
        p_Var9 = pp_Var7[uVar14];
        if (0 < p_Var9->out_count) {
          uVar12 = 0;
          do {
            if (p_Var9->out_links[uVar12] == iVar6) {
              if (0 < (long)p_Var10->stone_count) {
                lVar11 = 0;
                do {
                  p_Var15 = pp_Var7[lVar11];
                  if (p_Var15->stone_id == p_Var9->out_links[uVar12]) goto LAB_00146ff7;
                  lVar11 = lVar11 + 1;
                } while (p_Var10->stone_count != lVar11);
              }
              p_Var15 = (EVdfg_stone_state)0x0;
LAB_00146ff7:
              iVar4 = CMtrace_val[0xd];
              if (master->cm->CMTrace_file == (FILE *)0x0) {
                iVar4 = CMtrace_init(master->cm,EVdfgVerbose);
              }
              if (iVar4 != 0) {
                if (CMtrace_PID != 0) {
                  pFVar3 = (FILE *)master->cm->CMTrace_file;
                  _Var5 = getpid();
                  pVar8 = pthread_self();
                  iVar6 = (int)local_60;
                  fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar8);
                }
                if (CMtrace_timing != 0) {
                  clock_gettime(1,&local_58);
                  fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                          local_58.tv_nsec);
                }
                fprintf((FILE *)master->cm->CMTrace_file,
                        "Found reporting stone as output %d of stone %d\n",uVar12 & 0xffffffff,
                        uVar14 & 0xffffffff);
              }
              fflush((FILE *)master->cm->CMTrace_file);
              parse_bridge_action_spec(p_Var15->action,(int *)&local_64,&local_38);
              iVar4 = CMtrace_val[0xd];
              if (master->cm->CMTrace_file == (FILE *)0x0) {
                iVar4 = CMtrace_init(master->cm,EVdfgVerbose);
              }
              if (iVar4 != 0) {
                if (CMtrace_PID != 0) {
                  pFVar3 = (FILE *)master->cm->CMTrace_file;
                  _Var5 = getpid();
                  pVar8 = pthread_self();
                  iVar6 = (int)local_60;
                  fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar8);
                }
                if (CMtrace_timing != 0) {
                  clock_gettime(1,&local_58);
                  fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                          local_58.tv_nsec);
                }
                fprintf((FILE *)master->cm->CMTrace_file,"Dead stone is %d\n",(ulong)local_64);
              }
              fflush((FILE *)master->cm->CMTrace_file);
            }
            uVar12 = uVar12 + 1;
            p_Var10 = p_Var2->deployed_state;
            pp_Var7 = p_Var10->stones;
            p_Var9 = pp_Var7[uVar14];
          } while ((long)uVar12 < (long)p_Var9->out_count);
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)p_Var2->stone_count);
    }
    if (p_Var2->stone_count < 1) {
      local_48 = (char *)0x0;
    }
    else {
      lVar11 = 0;
      local_48 = (char *)0x0;
      do {
        p_Var9 = p_Var2->deployed_state->stones[lVar11];
        if (p_Var9->stone_id == local_64) {
          uVar1 = p_Var9->node;
          lVar13 = (long)(int)uVar1;
          local_40 = lVar11;
          iVar6 = CMtrace_val[0xd];
          if (master->cm->CMTrace_file == (FILE *)0x0) {
            iVar6 = CMtrace_init(master->cm,EVdfgVerbose);
          }
          if (iVar6 != 0) {
            if (CMtrace_PID != 0) {
              pFVar3 = (FILE *)master->cm->CMTrace_file;
              _Var5 = getpid();
              pVar8 = pthread_self();
              fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar8);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_58);
              fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                      local_58.tv_nsec);
            }
            fprintf((FILE *)master->cm->CMTrace_file,"Dead node is %d, name %s\n",(ulong)uVar1,
                    master->nodes[lVar13].canonical_name);
          }
          fflush((FILE *)master->cm->CMTrace_file);
          local_60 = lVar13 * 0x38;
          local_48 = master->nodes[lVar13].canonical_name;
          master->nodes[lVar13].shutdown_status_contribution = -3;
          lVar11 = local_40;
          if (0 < p_Var2->stone_count) {
            lVar13 = 0;
            do {
              if (p_Var2->deployed_state->stones[lVar13]->node == uVar1) {
                iVar6 = CMtrace_val[0xd];
                if (master->cm->CMTrace_file == (FILE *)0x0) {
                  iVar6 = CMtrace_init(master->cm,EVdfgVerbose);
                }
                if (iVar6 != 0) {
                  if (CMtrace_PID != 0) {
                    pFVar3 = (FILE *)master->cm->CMTrace_file;
                    _Var5 = getpid();
                    pVar8 = pthread_self();
                    fprintf(pFVar3,"P%lxT%lx - ",(long)_Var5,pVar8);
                  }
                  if (CMtrace_timing != 0) {
                    clock_gettime(1,&local_58);
                    fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                            local_58.tv_nsec);
                  }
                  fprintf((FILE *)master->cm->CMTrace_file,"Dead node is %d, name %s\n",(ulong)uVar1
                          ,*(undefined8 *)((long)&master->nodes->canonical_name + local_60));
                }
                fflush((FILE *)master->cm->CMTrace_file);
                p_Var2->deployed_state->stones[lVar13]->condition = EVstone_Lost;
              }
              lVar13 = lVar13 + 1;
              lVar11 = local_40;
            } while (lVar13 < p_Var2->stone_count);
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < p_Var2->stone_count);
    }
    IntCManager_unlock(master->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0x447);
    (*master->node_fail_handler)(p_Var2,local_48,local_64);
    IntCManager_lock(master->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0x449);
    master->reconfig = 1;
    master->sig_reconfig_bool = 1;
    check_all_nodes_registered(master);
  }
  return;
}

Assistant:

static void 
handle_conn_shutdown(EVmaster master, EVmaster_msg_ptr msg)
{
    int stone = msg->u.conn_shutdown.stone;
    EVdfg_stone_state reporting_stone = find_stone_state(stone, master->dfg->deployed_state);
    EVdfg dfg = master->dfg;

    /* this stone is automatically frozen by EVPath */
    reporting_stone->condition = EVstone_Frozen;
    master->state = DFG_Reconfiguring;
    
    CMtrace_out(master->cm, EVdfgVerbose, "EVDFG conn_shutdown_handler -  master DFG state is now %s\n", str_state[master->state]);
    if (master->node_fail_handler != NULL) {
	int i;
	int target_stone = -1;
	char *failed_node = NULL;
	char *contact_str = NULL;
	CMtrace_out(master->cm, EVdfgVerbose, "IN CONN_SHUTDOWN_HANDLER\n");
	for (i=0; i< dfg->stone_count; i++) {
	    int j;
	    for (j = 0; j < dfg->deployed_state->stones[i]->out_count; j++) {
		if (dfg->deployed_state->stones[i]->out_links[j] == stone) {
		    int out_stone_id = dfg->deployed_state->stones[i]->out_links[j];
		    EVdfg_stone_state out_stone = find_stone_state(out_stone_id, dfg->deployed_state);
		    CMtrace_out(master->cm, EVdfgVerbose, "Found reporting stone as output %d of stone %d\n",
				j, i);
		    parse_bridge_action_spec(out_stone->action, 
					     &target_stone, &contact_str);
		    CMtrace_out(master->cm, EVdfgVerbose, "Dead stone is %d\n", target_stone);
		}
	    }
	}
	for (i=0; i< dfg->stone_count; i++) {
	    if (dfg->deployed_state->stones[i]->stone_id == target_stone) {
		int node = dfg->deployed_state->stones[i]->node;
		int j;
		CMtrace_out(master->cm, EVdfgVerbose, "Dead node is %d, name %s\n", node,
			    master->nodes[node].canonical_name);
		failed_node = master->nodes[node].canonical_name;
		master->nodes[node].shutdown_status_contribution = STATUS_FAILED;
		for (j=0; j< dfg->stone_count; j++) {
		    if (dfg->deployed_state->stones[j]->node == node) {;
			CMtrace_out(master->cm, EVdfgVerbose, "Dead node is %d, name %s\n", node,
				    master->nodes[node].canonical_name);
			dfg->deployed_state->stones[j]->condition = EVstone_Lost;
		    }
		}
	    }
	}
	CManager_unlock(master->cm);
	master->node_fail_handler(dfg, failed_node, target_stone);
	CManager_lock(master->cm);
	master->reconfig = 1;
	master->sig_reconfig_bool = 1;
	check_all_nodes_registered(master);
    }
}